

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O0

void text_subtitles::TextSubtitlesRender::addBorder
               (int borderWidth,uint8_t *data,int width,int height)

{
  int local_40;
  int local_3c;
  int x_1;
  int y_1;
  int x;
  int y;
  uint32_t *dst;
  int i;
  int height_local;
  int width_local;
  uint8_t *data_local;
  int borderWidth_local;
  
  for (dst._4_4_ = 0; dst._4_4_ < borderWidth; dst._4_4_ = dst._4_4_ + 1) {
    _x = (int *)data;
    for (y_1 = 0; y_1 < height; y_1 = y_1 + 1) {
      for (x_1 = 0; x_1 < width; x_1 = x_1 + 1) {
        if ((*_x != 0) && (*_x != 0x10101)) {
          if (0 < x_1) {
            setBPoint((uint32_t *)(_x + -1));
            if (0 < y_1) {
              setBPoint((uint32_t *)(_x + (-1 - (long)width)));
            }
            if (y_1 < height + -1) {
              setBPoint((uint32_t *)(_x + (long)width + -1));
            }
          }
          if (0 < y_1) {
            setBPoint((uint32_t *)(_x + -(long)width));
          }
          if (y_1 < height + -1) {
            setBPoint((uint32_t *)(_x + width));
          }
          if (x_1 < width + -1) {
            setBPoint((uint32_t *)(_x + 1));
            if (0 < y_1) {
              setBPoint((uint32_t *)(_x + (1 - (long)width)));
            }
            if (y_1 < height + -1) {
              setBPoint((uint32_t *)(_x + (long)width + 1));
            }
          }
        }
        _x = _x + 1;
      }
    }
    _x = (int *)data;
    for (local_3c = 0; local_3c < height; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < width; local_40 = local_40 + 1) {
        if (*_x == 0x10101) {
          *_x = -0xfdfdfe;
        }
        _x = _x + 1;
      }
    }
  }
  return;
}

Assistant:

void TextSubtitlesRender::addBorder(const int borderWidth, uint8_t* data, const int width, const int height)
{
    // add black border
    for (int i = 0; i < borderWidth; ++i)
    {
        auto dst = reinterpret_cast<uint32_t*>(data);
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                if (*dst != 0 && *dst != BORDER_COLOR_TMP)
                {
                    if (x > 0)
                    {
                        setBPoint(dst - 1);
                        if (y > 0)
                            setBPoint(dst - 1 - width);
                        if (y < height - 1)
                            setBPoint(dst - 1 + width);
                    }
                    if (y > 0)
                        setBPoint(dst - width);
                    if (y < height - 1)
                        setBPoint(dst + width);
                    if (x < width - 1)
                    {
                        setBPoint(dst + 1);
                        if (y > 0)
                            setBPoint(dst + 1 - width);
                        if (y < height - 1)
                            setBPoint(dst + 1 + width);
                    }
                }
                dst++;
            }
        }
        dst = reinterpret_cast<uint32_t*>(data);
        for (int y = 0; y < height; ++y)
            for (int x = 0; x < width; ++x)
            {
                if (*dst == BORDER_COLOR_TMP)
                    *dst = BORDER_COLOR;
                dst++;
            }
    }
}